

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

PgHdr1 * pcache1FetchStage2(PCache1 *pCache,uint iKey,int createFlag)

{
  undefined8 *puVar1;
  PGroup *pPVar2;
  PCache1 *pPVar3;
  PgHdr1 *pPVar4;
  PgHdr1 *pPVar5;
  int iVar6;
  void *pvVar7;
  long lVar8;
  PgHdr1 **ppPVar9;
  u64 uVar10;
  ulong uVar11;
  uint uVar12;
  PgHdr1 **ppPVar13;
  int iVar14;
  u64 n;
  PgHdr1 *pPVar15;
  
  pPVar2 = pCache->pGroup;
  if (createFlag == 1) {
    uVar12 = pCache->nPage - pCache->nRecyclable;
    if (pPVar2->mxPinned <= uVar12) {
      return (PgHdr1 *)0x0;
    }
    if (pCache->n90pct <= uVar12) {
      return (PgHdr1 *)0x0;
    }
    if ((pcache1_g.nSlot == 0) ||
       (iVar14 = pcache1_g.bUnderPressure, pcache1_g.szSlot < pCache->szExtra + pCache->szPage)) {
      iVar14 = mem0.nearlyFull;
    }
    if (iVar14 != 0 && pCache->nRecyclable < uVar12) {
      return (PgHdr1 *)0x0;
    }
  }
  if (pCache->nHash <= pCache->nPage) {
    pcache1ResizeHash(pCache);
  }
  iVar14 = pCache->bPurgeable;
  if ((iVar14 != 0) && (pPVar15 = (pPVar2->lru).pLruPrev, pPVar15->isAnchor == 0)) {
    if (pCache->nPage + 1 < pCache->nMax) {
      iVar6 = mem0.nearlyFull;
      if ((pcache1_g.nSlot != 0) && (pCache->szExtra + pCache->szPage <= pcache1_g.szSlot)) {
        iVar6 = pcache1_g.bUnderPressure;
      }
      if (iVar6 == 0) goto LAB_001c0b3d;
    }
    pPVar3 = pPVar15->pCache;
    ppPVar9 = pPVar3->apHash + (ulong)pPVar15->iKey % (ulong)pPVar3->nHash;
    do {
      ppPVar13 = ppPVar9;
      pPVar4 = *ppPVar13;
      ppPVar9 = &pPVar4->pNext;
    } while (pPVar4 != pPVar15);
    *ppPVar13 = *ppPVar9;
    pPVar3->nPage = pPVar3->nPage - 1;
    pPVar4 = pPVar15->pLruNext;
    pPVar5 = pPVar15->pLruPrev;
    pPVar5->pLruNext = pPVar4;
    pPVar4->pLruPrev = pPVar5;
    pPVar15->pLruNext = (PgHdr1 *)0x0;
    pPVar3 = pPVar15->pCache;
    pPVar3->nRecyclable = pPVar3->nRecyclable - 1;
    if (pPVar3->szAlloc == pCache->szAlloc) {
      pPVar2->nPurgeable = pPVar2->nPurgeable + (iVar14 - pPVar3->bPurgeable);
      goto LAB_001c0c0d;
    }
    pcache1FreePage(pPVar15);
  }
LAB_001c0b3d:
  pPVar15 = pCache->pFree;
  if (pPVar15 == (PgHdr1 *)0x0) {
    if (((pCache->nPage == 0) && (pcache1_g.nInitPage != 0)) && (2 < pCache->nMax)) {
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      if (pcache1_g.nInitPage < 1) {
        uVar10 = (long)pcache1_g.nInitPage * -0x400;
        lVar8 = (long)pCache->szAlloc;
      }
      else {
        lVar8 = (long)pCache->szAlloc;
        uVar10 = (ulong)(uint)pcache1_g.nInitPage * lVar8;
      }
      n = (ulong)pCache->nMax * lVar8;
      if ((long)uVar10 < (long)n) {
        n = uVar10;
      }
      pvVar7 = sqlite3Malloc(n);
      pCache->pBulk = pvVar7;
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
      if (pvVar7 == (void *)0x0) {
        pPVar15 = pCache->pFree;
        if (pPVar15 == (PgHdr1 *)0x0) goto LAB_001c0b62;
      }
      else {
        iVar6 = (*sqlite3Config.m.xSize)(pvVar7);
        iVar14 = pCache->szAlloc;
        uVar11 = (long)iVar6 / (long)iVar14 & 0xffffffff;
        lVar8 = (long)pCache->szPage;
        pPVar15 = pCache->pFree;
        do {
          *(void **)((long)pvVar7 + lVar8) = pvVar7;
          *(long *)((long)pvVar7 + lVar8 + 8) = (long)pvVar7 + lVar8 + 0x38;
          *(undefined4 *)((long)pvVar7 + lVar8 + 0x14) = 1;
          *(PgHdr1 **)((long)pvVar7 + lVar8 + 0x18) = pPVar15;
          pPVar15 = (PgHdr1 *)((long)pvVar7 + lVar8);
          *(undefined8 *)((long)pvVar7 + lVar8 + 0x30) = 0;
          pvVar7 = (void *)((long)pvVar7 + (long)iVar14);
          uVar12 = (int)uVar11 - 1;
          uVar11 = (ulong)uVar12;
        } while (uVar12 != 0);
        pPVar15 = (PgHdr1 *)((long)pvVar7 + (lVar8 - iVar14));
      }
      goto LAB_001c0b46;
    }
LAB_001c0b62:
    if (createFlag == 1) {
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      pvVar7 = pcache1Alloc(pCache->szAlloc);
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
    }
    else {
      pvVar7 = pcache1Alloc(pCache->szAlloc);
    }
    if (pvVar7 == (void *)0x0) {
      return (PgHdr1 *)0x0;
    }
    lVar8 = (long)pCache->szPage;
    pPVar15 = (PgHdr1 *)((long)pvVar7 + lVar8);
    puVar1 = (undefined8 *)((long)pvVar7 + lVar8);
    *puVar1 = pvVar7;
    puVar1[1] = puVar1 + 7;
    *(undefined4 *)((long)puVar1 + 0x14) = 0;
    ppPVar9 = (PgHdr1 **)((long)pvVar7 + lVar8 + 0x30);
  }
  else {
LAB_001c0b46:
    ppPVar9 = &pPVar15->pNext;
    pCache->pFree = pPVar15->pNext;
  }
  *ppPVar9 = (PgHdr1 *)0x0;
  *pCache->pnPurgeable = *pCache->pnPurgeable + 1;
LAB_001c0c0d:
  uVar11 = (ulong)iKey % (ulong)pCache->nHash;
  pCache->nPage = pCache->nPage + 1;
  pPVar15->iKey = iKey;
  pPVar15->pNext = pCache->apHash[uVar11];
  pPVar15->pCache = pCache;
  pPVar15->pLruNext = (PgHdr1 *)0x0;
  *(undefined8 *)(pPVar15->page).pExtra = 0;
  pCache->apHash[uVar11] = pPVar15;
  if (pCache->iMaxKey < iKey) {
    pCache->iMaxKey = iKey;
  }
  return pPVar15;
}

Assistant:

static SQLITE_NOINLINE PgHdr1 *pcache1FetchStage2(
  PCache1 *pCache,
  unsigned int iKey,
  int createFlag
){
  unsigned int nPinned;
  PGroup *pGroup = pCache->pGroup;
  PgHdr1 *pPage = 0;

  /* Step 3: Abort if createFlag is 1 but the cache is nearly full */
  assert( pCache->nPage >= pCache->nRecyclable );
  nPinned = pCache->nPage - pCache->nRecyclable;
  assert( pGroup->mxPinned == pGroup->nMaxPage + 10 - pGroup->nMinPage );
  assert( pCache->n90pct == pCache->nMax*9/10 );
  if( createFlag==1 && (
        nPinned>=pGroup->mxPinned
     || nPinned>=pCache->n90pct
     || (pcache1UnderMemoryPressure(pCache) && pCache->nRecyclable<nPinned)
  )){
    return 0;
  }

  if( pCache->nPage>=pCache->nHash ) pcache1ResizeHash(pCache);
  assert( pCache->nHash>0 && pCache->apHash );

  /* Step 4. Try to recycle a page. */
  if( pCache->bPurgeable
   && !pGroup->lru.pLruPrev->isAnchor
   && ((pCache->nPage+1>=pCache->nMax) || pcache1UnderMemoryPressure(pCache))
  ){
    PCache1 *pOther;
    pPage = pGroup->lru.pLruPrev;
    assert( PAGE_IS_UNPINNED(pPage) );
    pcache1RemoveFromHash(pPage, 0);
    pcache1PinPage(pPage);
    pOther = pPage->pCache;
    if( pOther->szAlloc != pCache->szAlloc ){
      pcache1FreePage(pPage);
      pPage = 0;
    }else{
      pGroup->nPurgeable -= (pOther->bPurgeable - pCache->bPurgeable);
    }
  }

  /* Step 5. If a usable page buffer has still not been found,
  ** attempt to allocate a new one.
  */
  if( !pPage ){
    pPage = pcache1AllocPage(pCache, createFlag==1);
  }

  if( pPage ){
    unsigned int h = iKey % pCache->nHash;
    pCache->nPage++;
    pPage->iKey = iKey;
    pPage->pNext = pCache->apHash[h];
    pPage->pCache = pCache;
    pPage->pLruNext = 0;
    /* pPage->pLruPrev = 0;
    ** No need to clear pLruPrev since it is not accessed when pLruNext==0 */
    *(void **)pPage->page.pExtra = 0;
    pCache->apHash[h] = pPage;
    if( iKey>pCache->iMaxKey ){
      pCache->iMaxKey = iKey;
    }
  }
  return pPage;
}